

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void enable_sources(vw *all,bool quiet,size_t passes,input_options *input_options)

{
  options_i *poVar1;
  size_t length;
  io_buf *piVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  __pid_t _Var6;
  ostream *poVar7;
  int *piVar8;
  char *pcVar9;
  shared_data *__dest;
  char *pcVar10;
  vw_exception *pvVar11;
  undefined1 uVar12;
  size_t sVar13;
  ushort uVar14;
  size_t i;
  int f;
  socklen_t size;
  sockaddr_in address;
  int enableTKA;
  int on;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e0;
  sockaddr_in client_address;
  stringstream msg;
  undefined4 uStack_4b4;
  undefined1 local_4b0 [8];
  ostream local_4a8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream __msg;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  ostream local_1a8;
  
  all->p->input->current = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_4e0,&input_options->cache_files);
  parse_cache(all,&local_4e0,input_options->kill_cache,quiet);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4e0);
  if ((all->daemon == false) && (all->active != true)) {
    piVar2 = all->p->input;
    if ((piVar2->files)._end == (piVar2->files)._begin) {
      std::__cxx11::string::string((string *)&msg,(string *)&all->data_filename);
      if (!quiet) {
        poVar7 = std::operator<<(&(all->trace_message).super_ostream,"Reading datafile = ");
        poVar7 = std::operator<<(poVar7,(string *)&msg);
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      piVar2 = all->p->input;
      (**piVar2->_vptr_io_buf)(piVar2,_msg,(ulong)all->stdin_off,1);
      if ((input_options->json == false) && (input_options->dsjson != true)) {
        all->p->reader = read_features_string;
        all->p->text_reader = VW::read_lines;
      }
      else {
        if ((all->audit == false) && (all->hash_inv != true)) {
          all->p->reader = read_features_json<false>;
          all->p->text_reader = line_to_examples_json<false>;
          all->p->audit = false;
          std::make_shared<json_parser<false>>();
          std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&all->p->jsonp,
                     (__shared_ptr<json_parser<false>,_(__gnu_cxx::_Lock_policy)2> *)&__msg);
        }
        else {
          all->p->reader = read_features_json<true>;
          all->p->text_reader = line_to_examples_json<true>;
          all->p->audit = true;
          std::make_shared<json_parser<true>>();
          std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&all->p->jsonp,
                     (__shared_ptr<json_parser<true>,_(__gnu_cxx::_Lock_policy)2> *)&__msg);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1b0);
        all->p->decision_service_json = input_options->dsjson;
      }
      all->p->resettable = all->p->write_cache;
      std::__cxx11::string::~string((string *)&msg);
    }
    else if (!quiet) {
      poVar7 = std::operator<<(&(all->trace_message).super_ostream,
                               "ignoring text input in favor of cache input");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
  }
  else {
    iVar5 = socket(2,1,0);
    all->p->bound_sock = iVar5;
    iVar5 = all->p->bound_sock;
    if (iVar5 < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&msg);
      poVar7 = std::operator<<(&local_4a8,"socket: ");
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      std::operator<<(poVar7,pcVar9);
      std::__cxx11::stringbuf::str();
      poVar7 = std::operator<<(&(all->trace_message).super_ostream,(string *)&__msg);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::__cxx11::string::~string((string *)&__msg);
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::__cxx11::stringbuf::str();
      std::operator<<(&local_1a8,
                      (char *)CONCAT44(address.sin_addr.s_addr,
                                       CONCAT22(address.sin_port,address.sin_family)));
      std::__cxx11::string::~string((string *)&address);
      pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar11,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                 ,0x153,&local_1d8);
      __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    on = 1;
    iVar5 = setsockopt(iVar5,1,2,&on,4);
    if (iVar5 < 0) {
      poVar7 = std::operator<<(&(all->trace_message).super_ostream,"setsockopt SO_REUSEADDR: ");
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      poVar7 = std::operator<<(poVar7,pcVar9);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    enableTKA = 1;
    iVar5 = setsockopt(all->p->bound_sock,1,9,&enableTKA,4);
    if (iVar5 < 0) {
      poVar7 = std::operator<<(&(all->trace_message).super_ostream,"setsockopt SO_KEEPALIVE: ");
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      poVar7 = std::operator<<(poVar7,pcVar9);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    address.sin_family = 2;
    address.sin_addr.s_addr = 0;
    poVar1 = all->options;
    std::__cxx11::string::string((string *)&msg,"port",(allocator *)&__msg);
    iVar5 = (*poVar1->_vptr_options_i[1])(poVar1,&msg);
    std::__cxx11::string::~string((string *)&msg);
    uVar14 = 0x67ae;
    if ((char)iVar5 != '\0') {
      uVar14 = (ushort)input_options->port;
    }
    address.sin_port = uVar14 << 8 | uVar14 >> 8;
    iVar5 = bind(all->p->bound_sock,(sockaddr *)&address,0x10);
    if (iVar5 < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&msg);
      poVar7 = &local_4a8;
      std::operator<<(poVar7,"bind");
      piVar8 = __errno_location();
      pcVar9 = (char *)&__msg;
      pcVar10 = strerror_r(*piVar8,pcVar9,0x100);
      if (pcVar10 == (char *)0x0) {
        poVar7 = std::operator<<(poVar7,"errno = ");
      }
      else {
        pcVar9 = "errno = unknown";
      }
      std::operator<<(poVar7,pcVar9);
      pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar11,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                 ,0x169,&local_1f8);
      __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    uVar12 = true;
    iVar5 = listen(all->p->bound_sock,1);
    if (iVar5 < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&msg);
      poVar7 = &local_4a8;
      std::operator<<(poVar7,"listen");
      piVar8 = __errno_location();
      pcVar9 = (char *)&__msg;
      pcVar10 = strerror_r(*piVar8,pcVar9,0x100);
      if (pcVar10 == (char *)0x0) {
        poVar7 = std::operator<<(poVar7,"errno = ");
      }
      else {
        pcVar9 = "errno = unknown";
      }
      std::operator<<(poVar7,pcVar9);
      pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar11,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                 ,0x16d,&local_218);
      __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    poVar1 = all->options;
    std::__cxx11::string::string((string *)&msg,"port_file",(allocator *)&__msg);
    iVar5 = (*poVar1->_vptr_options_i[1])(poVar1,&msg);
    std::__cxx11::string::~string((string *)&msg);
    if ((char)iVar5 != '\0') {
      client_address.sin_family = 0x10;
      client_address.sin_port = 0;
      iVar5 = getsockname(all->p->bound_sock,(sockaddr *)&address,(socklen_t *)&client_address);
      if (iVar5 < 0) {
        poVar7 = std::operator<<(&(all->trace_message).super_ostream,"getsockname: ");
        piVar8 = __errno_location();
        pcVar9 = strerror(*piVar8);
        poVar7 = std::operator<<(poVar7,pcVar9);
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      std::ofstream::ofstream(&msg);
      std::ofstream::open((char *)&msg,(_Ios_Openmode)(input_options->port_file)._M_dataplus._M_p);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        poVar7 = std::operator<<(&local_1a8,"error writing port file: ");
        std::operator<<(poVar7,(string *)&input_options->port_file);
        pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar11,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                   ,0x17a,&local_238);
        __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      poVar7 = (ostream *)
               std::ostream::operator<<(&msg,address.sin_port << 8 | address.sin_port >> 8);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::ofstream::close();
      std::ofstream::~ofstream(&msg);
    }
    if ((input_options->foreground == false) && (all->active == false)) {
      iVar5 = daemon(1,1);
      if (iVar5 != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&msg);
        poVar7 = &local_4a8;
        std::operator<<(poVar7,"daemon");
        piVar8 = __errno_location();
        pcVar9 = (char *)&__msg;
        pcVar10 = strerror_r(*piVar8,pcVar9,0x100);
        if (pcVar10 == (char *)0x0) {
          poVar7 = std::operator<<(poVar7,"errno = ");
        }
        else {
          pcVar9 = "errno = unknown";
        }
        std::operator<<(poVar7,pcVar9);
        pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar11,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                   ,0x185,&local_258);
        __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    poVar1 = all->options;
    std::__cxx11::string::string((string *)&msg,"pid_file",(allocator *)&__msg);
    iVar5 = (*poVar1->_vptr_options_i[1])(poVar1,&msg);
    std::__cxx11::string::~string((string *)&msg);
    if ((char)iVar5 != '\0') {
      std::ofstream::ofstream(&msg);
      std::ofstream::open((char *)&msg,(_Ios_Openmode)(input_options->pid_file)._M_dataplus._M_p);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        std::operator<<(&local_1a8,"error writing pid file");
        pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar11,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                   ,0x18e,&local_278);
        __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      _Var6 = getpid();
      poVar7 = (ostream *)std::ostream::operator<<(&msg,_Var6);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::ofstream::close();
      std::ofstream::~ofstream(&msg);
    }
    if ((all->daemon == true) && (all->active == false)) {
      fclose(_stdin);
      parameters::share(&all->weights,1L << ((byte)all->num_bits & 0x3f));
      sVar13 = 0;
      __dest = (shared_data *)mmap64((void *)0x0,0xe0,3,0x21,-1,0);
      memcpy(__dest,all->sd,0xe0);
      free(all->sd);
      all->sd = __dest;
      length = all->num_children;
      local_1a8._vptr_basic_ostream = (_func_int **)0x0;
      local_1a8._8_8_ = 0;
      ___msg = (element_type *)0x0;
      _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      v_array<int>::resize((v_array<int> *)&__msg,length);
      do {
        if (length == sVar13) {
          memset(local_4b0,0,0x90);
          _msg = handle_sigterm;
          sigaction(0xf,(sigaction *)&msg,(sigaction *)0x0);
          do {
            do {
              _Var6 = wait((sigaction *)&msg);
              if (got_sigterm == true) {
                for (sVar13 = 0; length != sVar13; sVar13 = sVar13 + 1) {
                  kill(*(__pid_t *)((long)&(___msg->reader).stack_.allocator_ + sVar13 * 4),0xf);
                }
                VW::finish(all,true);
                exit(0);
              }
            } while (_Var6 < 0);
            for (sVar13 = 0; length != sVar13; sVar13 = sVar13 + 1) {
              if (_Var6 == *(int *)((long)&(___msg->reader).stack_.allocator_ + sVar13 * 4)) {
                _Var6 = fork();
                *(__pid_t *)((long)&(___msg->reader).stack_.allocator_ + sVar13 * 4) = _Var6;
                if (_Var6 == 0) {
                  all->quiet = (bool)(all->quiet | sVar13 != 0);
                  goto LAB_001a59c4;
                }
                break;
              }
            }
          } while( true );
        }
        _Var6 = fork();
        *(__pid_t *)((long)&(___msg->reader).stack_.allocator_ + sVar13 * 4) = _Var6;
        if (_Var6 == 0) {
          all->quiet = (bool)(all->quiet | sVar13 != 0);
          break;
        }
        sVar13 = sVar13 + 1;
      } while( true );
    }
LAB_001a59c4:
    size = 0x10;
    all->p->max_fd = 0;
    if (all->quiet == false) {
      poVar7 = std::operator<<(&(all->trace_message).super_ostream,"calling accept");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    f = accept(all->p->bound_sock,(sockaddr *)&client_address,&size);
    if (f < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&msg);
      poVar7 = &local_4a8;
      std::operator<<(poVar7,"accept");
      piVar8 = __errno_location();
      pcVar9 = (char *)&__msg;
      pcVar10 = strerror_r(*piVar8,pcVar9,0x100);
      if (pcVar10 == (char *)0x0) {
        poVar7 = std::operator<<(poVar7,"errno = ");
      }
      else {
        pcVar9 = "errno = unknown";
      }
      std::operator<<(poVar7,pcVar9);
      pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar11,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                 ,0x1e3,&local_298);
      __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    all->p->label_sock = f;
    all->print = print_result;
    _msg = f;
    v_array<int>::push_back(&all->final_prediction_sink,(int *)&msg);
    v_array<int>::push_back(&all->p->input->files,&f);
    iVar5 = all->p->max_fd;
    if (iVar5 < f) {
      iVar5 = f;
    }
    all->p->max_fd = iVar5;
    if (all->quiet == false) {
      poVar7 = std::operator<<(&(all->trace_message).super_ostream,"reading data from port ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar14);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    piVar8 = &all->p->max_fd;
    *piVar8 = *piVar8 + 1;
    if (all->active == true) {
      all->p->reader = read_features_string;
    }
    else {
      bVar4 = isbinary(all->p->input);
      if (bVar4) {
        all->p->reader = read_cached_features;
        all->print = binary_print_result;
      }
      else {
        all->p->reader = read_features_string;
      }
      all->p->sorted_cache = true;
    }
    if (all->p->write_cache == false) {
      uVar12 = (undefined1)*(undefined4 *)&all->daemon;
    }
    all->p->resettable = (bool)uVar12;
  }
  if ((1 < passes) && (all->p->resettable == false)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    std::operator<<(&local_4a8,"need a cache file for multiple passes : try using --cache_file");
    pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar11,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
               ,0x23e,&local_2b8);
    __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  piVar2 = all->p->input;
  piVar2->count = (long)(piVar2->files)._end - (long)(piVar2->files)._begin >> 2;
  if ((!quiet) && (all->daemon == false)) {
    poVar7 = std::operator<<(&(all->trace_message).super_ostream,"num sources = ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  return;
}

Assistant:

void enable_sources(vw& all, bool quiet, size_t passes, input_options& input_options)
{
  all.p->input->current = 0;
  parse_cache(all, input_options.cache_files, input_options.kill_cache, quiet);

  if (all.daemon || all.active)
  {
#ifdef _WIN32
    WSAData wsaData;
    int lastError = WSAStartup(MAKEWORD(2, 2), &wsaData);
    if (lastError != 0)
      THROWERRNO("WSAStartup() returned error:" << lastError);
#endif
    all.p->bound_sock = (int)socket(PF_INET, SOCK_STREAM, 0);
    if (all.p->bound_sock < 0)
    {
      stringstream msg;
      msg << "socket: " << strerror(errno);
      all.trace_message << msg.str() << endl;
      THROW(msg.str().c_str());
    }

    int on = 1;
    if (setsockopt(all.p->bound_sock, SOL_SOCKET, SO_REUSEADDR, (char*)&on, sizeof(on)) < 0)
      all.trace_message << "setsockopt SO_REUSEADDR: " << strerror(errno) << endl;

    // Enable TCP Keep Alive to prevent socket leaks
    int enableTKA = 1;
    if (setsockopt(all.p->bound_sock, SOL_SOCKET, SO_KEEPALIVE, (char*)&enableTKA, sizeof(enableTKA)) < 0)
      all.trace_message << "setsockopt SO_KEEPALIVE: " << strerror(errno) << endl;

    sockaddr_in address;
    address.sin_family = AF_INET;
    address.sin_addr.s_addr = htonl(INADDR_ANY);
    short unsigned int port = 26542;
    if (all.options->was_supplied("port"))
      port = (uint16_t)input_options.port;
    address.sin_port = htons(port);

    // attempt to bind to socket
    if (::bind(all.p->bound_sock, (sockaddr*)&address, sizeof(address)) < 0)
      THROWERRNO("bind");

    // listen on socket
    if (listen(all.p->bound_sock, 1) < 0)
      THROWERRNO("listen");

    // write port file
    if (all.options->was_supplied("port_file"))
    {
      socklen_t address_size = sizeof(address);
      if (getsockname(all.p->bound_sock, (sockaddr*)&address, &address_size) < 0)
      {
        all.trace_message << "getsockname: " << strerror(errno) << endl;
      }
      ofstream port_file;
      port_file.open(input_options.port_file.c_str());
      if (!port_file.is_open())
        THROW("error writing port file: " << input_options.port_file);

      port_file << ntohs(address.sin_port) << endl;
      port_file.close();
    }

    // background process (if foreground is not set)
    if (!input_options.foreground)
    {
      // FIXME switch to posix_spawn
      if (!all.active && daemon(1, 1))
        THROWERRNO("daemon");
    }

    // write pid file
    if (all.options->was_supplied("pid_file"))
    {
      ofstream pid_file;
      pid_file.open(input_options.pid_file.c_str());
      if (!pid_file.is_open())
        THROW("error writing pid file");

      pid_file << getpid() << endl;
      pid_file.close();
    }

    if (all.daemon && !all.active)
    {
#ifdef _WIN32
      THROW("not supported on windows");
#else
      fclose(stdin);
      // weights will be shared across processes, accessible to children
      all.weights.share(all.length());

      // learning state to be shared across children
      shared_data* sd =
          (shared_data*)mmap(0, sizeof(shared_data), PROT_READ | PROT_WRITE, MAP_SHARED | MAP_ANONYMOUS, -1, 0);
      memcpy(sd, all.sd, sizeof(shared_data));
      free(all.sd);
      all.sd = sd;

      // create children
      size_t num_children = all.num_children;
      v_array<int> children = v_init<int>();
      children.resize(num_children);
      for (size_t i = 0; i < num_children; i++)
      {
        // fork() returns pid if parent, 0 if child
        // store fork value and run child process if child
        if ((children[i] = fork()) == 0)
        {
          all.quiet |= (i > 0);
          goto child;
        }
      }

      // install signal handler so we can kill children when killed
      {
        struct sigaction sa;
        // specifically don't set SA_RESTART in sa.sa_flags, so that
        // waitid will be interrupted by SIGTERM with handler installed
        memset(&sa, 0, sizeof(sa));
        sa.sa_handler = handle_sigterm;
        sigaction(SIGTERM, &sa, nullptr);
      }

      while (true)
      {
        // wait for child to change state; if finished, then respawn
        int status;
        pid_t pid = wait(&status);
        if (got_sigterm)
        {
          for (size_t i = 0; i < num_children; i++) kill(children[i], SIGTERM);
          VW::finish(all);
          exit(0);
        }
        if (pid < 0)
          continue;
        for (size_t i = 0; i < num_children; i++)
          if (pid == children[i])
          {
            if ((children[i] = fork()) == 0)
            {
              all.quiet |= (i > 0);
              goto child;
            }
            break;
          }
      }

#endif
    }

#ifndef _WIN32
  child:
#endif
    sockaddr_in client_address;
    socklen_t size = sizeof(client_address);
    all.p->max_fd = 0;
    if (!all.quiet)
      all.trace_message << "calling accept" << endl;
    int f = (int)accept(all.p->bound_sock, (sockaddr*)&client_address, &size);
    if (f < 0)
      THROWERRNO("accept");

    all.p->label_sock = f;
    all.print = print_result;

    all.final_prediction_sink.push_back((size_t)f);

    all.p->input->files.push_back(f);
    all.p->max_fd = max(f, all.p->max_fd);
    if (!all.quiet)
      all.trace_message << "reading data from port " << port << endl;

    all.p->max_fd++;
    if (all.active)
      all.p->reader = read_features_string;
    else
    {
      if (isbinary(*(all.p->input)))
      {
        all.p->reader = read_cached_features;
        all.print = binary_print_result;
      }
      else
      {
        all.p->reader = read_features_string;
      }
      all.p->sorted_cache = true;
    }
    all.p->resettable = all.p->write_cache || all.daemon;
  }
  else
  {
    if (all.p->input->files.size() > 0)
    {
      if (!quiet)
        all.trace_message << "ignoring text input in favor of cache input" << endl;
    }
    else
    {
      string temp = all.data_filename;
      if (!quiet)
        all.trace_message << "Reading datafile = " << temp << endl;
      try
      {
        all.p->input->open_file(temp.c_str(), all.stdin_off, io_buf::READ);
      }
      catch (exception const& ex)
      {
        // when trying to fix this exception, consider that an empty temp is valid if all.stdin_off is false
        if (temp.size() != 0)
        {
          all.trace_message << "can't open '" << temp << "', sailing on!" << endl;
        }
        else
        {
          throw ex;
        }
      }

      if (input_options.json || input_options.dsjson)
      {
        // TODO: change to class with virtual method
        // --invert_hash requires the audit parser version to save the extra information.
        if (all.audit || all.hash_inv)
        {
          all.p->reader = &read_features_json<true>;
          all.p->text_reader = &line_to_examples_json<true>;
          all.p->audit = true;
          all.p->jsonp = std::make_shared<json_parser<true>>();
        }
        else
        {
          all.p->reader = &read_features_json<false>;
          all.p->text_reader = &line_to_examples_json<false>;
          all.p->audit = false;
          all.p->jsonp = std::make_shared<json_parser<false>>();
        }

        all.p->decision_service_json = input_options.dsjson;
      }
      else
      {
        all.p->reader = read_features_string;
        all.p->text_reader = VW::read_lines;
      }

      all.p->resettable = all.p->write_cache;
    }
  }

  if (passes > 1 && !all.p->resettable)
    THROW("need a cache file for multiple passes : try using --cache_file");

  all.p->input->count = all.p->input->files.size();
  if (!quiet && !all.daemon)
    all.trace_message << "num sources = " << all.p->input->files.size() << endl;
}